

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

ClassDef * __thiscall ClassDef::toJson(ClassDef *this)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  undefined8 *puVar6;
  PropertyDef *propDef;
  char **rhs;
  ClassDef *cdef;
  long lVar7;
  long in_RSI;
  storage_type *psVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QLatin1String QVar12;
  QByteArrayView QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QByteArrayView QVar16;
  QLatin1String QVar17;
  QByteArrayView QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QLatin1String QVar25;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QByteArrayView QVar29;
  QLatin1String QVar30;
  QByteArrayView QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QByteArrayView QVar35;
  QLatin1String QVar36;
  QByteArrayView QVar37;
  QLatin1String QVar38;
  QLatin1String QVar39;
  anon_class_16_2_d6ba3f70 aVar40;
  undefined1 auVar41 [16];
  QList<ClassDef::Interface> *__range2;
  QJsonObject ifaceJson;
  QJsonArray jsonList;
  QJsonArray ifaces;
  QJsonObject infoJson;
  QJsonArray enums;
  QJsonArray superClasses;
  QJsonArray props;
  int methodIndex;
  QJsonArray classInfos;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  int local_94;
  undefined1 *local_90;
  anon_class_16_2_d6ba3f70 local_88;
  undefined1 local_78 [32];
  QArrayData *local_58;
  char16_t *pcStack_50;
  Data *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_BaseDef).classname.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  puVar6 = *(undefined8 **)(in_RSI + 8);
  if (puVar6 == (undefined8 *)0x0) {
    puVar6 = &QByteArray::_empty;
  }
  psVar8 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar1 = psVar8 + (long)puVar6 + 1;
    psVar8 = psVar8 + 1;
  } while (*pcVar1 != '\0');
  QVar11.m_data = psVar8;
  QVar11.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar11);
  QJsonValue::QJsonValue((QJsonValue *)&local_58,(QString *)local_78);
  QVar12.m_data = (char *)0x9;
  QVar12.m_size = (qsizetype)this;
  local_88 = (anon_class_16_2_d6ba3f70)QJsonObject::operator[](QVar12);
  QJsonValueRef::operator=((QJsonValueRef *)&local_88,(QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  puVar6 = *(undefined8 **)(in_RSI + 0x20);
  if (puVar6 == (undefined8 *)0x0) {
    puVar6 = &QByteArray::_empty;
  }
  psVar8 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar1 = psVar8 + (long)puVar6 + 1;
    psVar8 = psVar8 + 1;
  } while (*pcVar1 != '\0');
  QVar13.m_data = psVar8;
  QVar13.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar13);
  QJsonValue::QJsonValue((QJsonValue *)&local_58,(QString *)local_78);
  QVar14.m_data = (char *)0x12;
  QVar14.m_size = (qsizetype)this;
  aVar40 = (anon_class_16_2_d6ba3f70)QJsonObject::operator[](QVar14);
  local_88 = aVar40;
  QJsonValueRef::operator=((QJsonValueRef *)&local_88,(QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  QJsonValue::QJsonValue((QJsonValue *)&local_58,*(longlong *)(in_RSI + 0x80));
  QVar15.m_data = (char *)0xa;
  QVar15.m_size = (qsizetype)this;
  local_78._0_16_ = QJsonObject::operator[](QVar15);
  QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_90);
  lVar5 = *(long *)(in_RSI + 0x40);
  if (lVar5 != 0) {
    lVar7 = *(long *)(in_RSI + 0x38);
    lVar9 = 0;
    do {
      local_c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QJsonObject::QJsonObject((QJsonObject *)local_c0);
      QVar16.m_data = *(storage_type **)(lVar7 + 0x10 + lVar9);
      QVar16.m_size = (qsizetype)local_78;
      QString::fromUtf8(QVar16);
      QJsonValue::QJsonValue((QJsonValue *)&local_58,(QString *)local_78);
      QVar17.m_data = (char *)0x4;
      QVar17.m_size = (qsizetype)local_c0;
      aVar40 = (anon_class_16_2_d6ba3f70)QJsonObject::operator[](QVar17);
      local_88 = aVar40;
      QJsonValueRef::operator=((QJsonValueRef *)&local_88,(QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      QVar18.m_data = *(storage_type **)(lVar7 + 0x28 + lVar9);
      QVar18.m_size = (qsizetype)local_78;
      QString::fromUtf8(QVar18);
      QJsonValue::QJsonValue((QJsonValue *)&local_58,(QString *)local_78);
      QVar19.m_data = (char *)0x5;
      QVar19.m_size = (qsizetype)local_c0;
      aVar40 = (anon_class_16_2_d6ba3f70)QJsonObject::operator[](QVar19);
      local_88 = aVar40;
      QJsonValueRef::operator=((QJsonValueRef *)&local_88,(QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonObject *)local_c0);
      QJsonArray::append((QJsonValue *)&local_90);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QJsonObject::~QJsonObject((QJsonObject *)local_c0);
      lVar9 = lVar9 + 0x30;
    } while (lVar5 * 0x30 != lVar9);
  }
  lVar5 = QJsonArray::size();
  if (lVar5 != 0) {
    QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonArray *)&local_90);
    QVar20.m_data = (char *)0xa;
    QVar20.m_size = (qsizetype)this;
    auVar41 = QJsonObject::operator[](QVar20);
    local_78._0_16_ = auVar41;
    QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)&local_58);
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  }
  local_88.methodIndex = &local_94;
  local_94 = 0;
  QVar21.m_data = (storage_type *)0x7;
  QVar21.m_size = (qsizetype)&local_58;
  local_88.cls = (QJsonObject *)this;
  QString::fromLatin1(QVar21);
  local_78._0_8_ = local_58;
  local_78._8_8_ = pcStack_50;
  local_78._16_8_ = local_48;
  toJson::anon_class_16_2_d6ba3f70::operator()
            (&local_88,(QString *)local_78,(QList<FunctionDef> *)(in_RSI + 0x110));
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  QVar22.m_data = (storage_type *)0x5;
  QVar22.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar22);
  local_78._0_8_ = local_58;
  local_78._8_8_ = pcStack_50;
  local_78._16_8_ = local_48;
  toJson::anon_class_16_2_d6ba3f70::operator()
            (&local_88,(QString *)local_78,(QList<FunctionDef> *)(in_RSI + 0x128));
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  QVar23.m_data = (storage_type *)0x7;
  QVar23.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar23);
  local_78._0_8_ = local_58;
  local_78._8_8_ = pcStack_50;
  local_78._16_8_ = local_48;
  toJson::anon_class_16_2_d6ba3f70::operator()
            (&local_88,(QString *)local_78,(QList<FunctionDef> *)(in_RSI + 0x140));
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  local_94 = 0;
  QVar24.m_data = (storage_type *)0xc;
  QVar24.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar24);
  local_78._0_8_ = local_58;
  local_78._8_8_ = pcStack_50;
  local_78._16_8_ = local_48;
  toJson::anon_class_16_2_d6ba3f70::operator()
            (&local_88,(QString *)local_78,(QList<FunctionDef> *)(in_RSI + 0xf8));
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_a0);
  if (*(long *)(in_RSI + 0x198) != 0) {
    lVar5 = *(long *)(in_RSI + 0x198) * 0x158;
    do {
      PropertyDef::toJson((PropertyDef *)local_78);
      QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonObject *)local_78);
      QJsonArray::append((QJsonValue *)&local_a0);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QJsonObject::~QJsonObject((QJsonObject *)local_78);
      lVar5 = lVar5 + -0x158;
    } while (lVar5 != 0);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonArray *)&local_a0);
    QVar25.m_data = (char *)0xa;
    QVar25.m_size = (qsizetype)this;
    local_78._0_16_ = QJsonObject::operator[](QVar25);
    QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)&local_58);
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  }
  if (*(char *)(in_RSI + 0x1a4) == '\x01') {
    QJsonValue::QJsonValue((QJsonValue *)&local_58,true);
    QVar26.m_data = (char *)0x6;
    QVar26.m_size = (qsizetype)this;
    auVar41 = QJsonObject::operator[](QVar26);
    local_78._0_16_ = auVar41;
    QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)&local_58);
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  }
  if (*(char *)(in_RSI + 0x1a5) == '\x01') {
    QJsonValue::QJsonValue((QJsonValue *)&local_58,true);
    QVar27.m_data = (char *)0x6;
    QVar27.m_size = (qsizetype)this;
    auVar41 = QJsonObject::operator[](QVar27);
    local_78._0_16_ = auVar41;
    QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)&local_58);
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  }
  if (*(char *)(in_RSI + 0x1a6) == '\x01') {
    QJsonValue::QJsonValue((QJsonValue *)&local_58,true);
    QVar28.m_data = (char *)0x9;
    QVar28.m_size = (qsizetype)this;
    auVar41 = QJsonObject::operator[](QVar28);
    local_78._0_16_ = auVar41;
    QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)&local_58);
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  }
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_a8);
  if (*(long *)(in_RSI + 0x98) != 0) {
    rhs = (char **)(*(long *)(in_RSI + 0x90) + 0x18);
    lVar5 = *(long *)(in_RSI + 0x98) * 0x38;
    do {
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      QJsonObject::QJsonObject((QJsonObject *)&local_b0);
      QVar29.m_data = rhs[-1];
      QVar29.m_size = (qsizetype)local_78;
      QString::fromUtf8(QVar29);
      QJsonValue::QJsonValue((QJsonValue *)&local_58,(QString *)local_78);
      QVar30.m_data = (char *)0x4;
      QVar30.m_size = (qsizetype)&local_b0;
      auVar41 = QJsonObject::operator[](QVar30);
      local_c0 = auVar41;
      QJsonValueRef::operator=((QJsonValueRef *)local_c0,(QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      bVar4 = operator!=((QByteArray *)(rhs + -3),(QByteArray *)rhs);
      if (bVar4) {
        QVar31.m_data = rhs[2];
        QVar31.m_size = (qsizetype)local_78;
        QString::fromUtf8(QVar31);
        QJsonValue::QJsonValue((QJsonValue *)&local_58,(QString *)local_78);
        QVar32.m_data = (char *)0x12;
        QVar32.m_size = (qsizetype)&local_b0;
        auVar41 = QJsonObject::operator[](QVar32);
        local_c0 = auVar41;
        QJsonValueRef::operator=((QJsonValueRef *)local_c0,(QJsonValue *)&local_58);
        QJsonValue::~QJsonValue((QJsonValue *)&local_58);
        if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
          }
        }
      }
      FunctionDef::accessToJson
                ((QJsonObject *)&local_b0,*(Access *)&(((QByteArray *)(rhs + 3))->d).d);
      QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonObject *)&local_b0);
      QJsonArray::append((QJsonValue *)&local_a8);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QJsonObject::~QJsonObject((QJsonObject *)&local_b0);
      rhs = rhs + 7;
      lVar5 = lVar5 + -0x38;
    } while (lVar5 != 0);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonArray *)&local_a8);
    QVar33.m_data = (char *)0xc;
    QVar33.m_size = (qsizetype)this;
    auVar41 = QJsonObject::operator[](QVar33);
    local_78._0_16_ = auVar41;
    QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)&local_58);
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  }
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_b0);
  if (*(long *)(in_RSI + 0x60) != 0) {
    cdef = *(ClassDef **)(in_RSI + 0x58);
    lVar5 = *(long *)(in_RSI + 0x60) * 0x68;
    do {
      EnumDef::toJson((EnumDef *)local_78,cdef);
      QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonObject *)local_78);
      QJsonArray::append((QJsonValue *)&local_b0);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QJsonObject::~QJsonObject((QJsonObject *)local_78);
      cdef = (ClassDef *)&(cdef->super_BaseDef).flagAliases;
      lVar5 = lVar5 + -0x68;
    } while (lVar5 != 0);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonArray *)&local_b0);
    QVar34.m_data = (char *)0x5;
    QVar34.m_size = (qsizetype)this;
    auVar41 = QJsonObject::operator[](QVar34);
    local_78._0_16_ = auVar41;
    QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)&local_58);
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  }
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_c8);
  if (*(long *)(in_RSI + 0xb0) != 0) {
    lVar7 = *(long *)(in_RSI + 0xa8);
    lVar5 = lVar7 + *(long *)(in_RSI + 0xb0) * 0x18;
    do {
      local_d0 = &DAT_aaaaaaaaaaaaaaaa;
      QJsonArray::QJsonArray((QJsonArray *)&local_d0);
      lVar9 = *(long *)(lVar7 + 0x10);
      if (lVar9 != 0) {
        lVar2 = *(long *)(lVar7 + 8);
        lVar10 = 0;
        do {
          local_d8 = &DAT_aaaaaaaaaaaaaaaa;
          QJsonObject::QJsonObject((QJsonObject *)&local_d8);
          QVar35.m_data = *(storage_type **)(lVar2 + 0x28 + lVar10);
          QVar35.m_size = (qsizetype)local_78;
          QString::fromUtf8(QVar35);
          QJsonValue::QJsonValue((QJsonValue *)&local_58,(QString *)local_78);
          QVar36.m_data = (char *)0x2;
          QVar36.m_size = (qsizetype)&local_d8;
          auVar41 = QJsonObject::operator[](QVar36);
          local_c0 = auVar41;
          QJsonValueRef::operator=((QJsonValueRef *)local_c0,(QJsonValue *)&local_58);
          QJsonValue::~QJsonValue((QJsonValue *)&local_58);
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
            }
          }
          QVar37.m_data = *(storage_type **)(lVar2 + 0x10 + lVar10);
          QVar37.m_size = (qsizetype)local_78;
          QString::fromUtf8(QVar37);
          QJsonValue::QJsonValue((QJsonValue *)&local_58,(QString *)local_78);
          QVar38.m_data = (char *)0x9;
          QVar38.m_size = (qsizetype)&local_d8;
          auVar41 = QJsonObject::operator[](QVar38);
          local_c0 = auVar41;
          QJsonValueRef::operator=((QJsonValueRef *)local_c0,(QJsonValue *)&local_58);
          QJsonValue::~QJsonValue((QJsonValue *)&local_58);
          if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
            }
          }
          QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonObject *)&local_d8);
          QJsonArray::append((QJsonValue *)&local_d0);
          QJsonValue::~QJsonValue((QJsonValue *)&local_58);
          QJsonObject::~QJsonObject((QJsonObject *)&local_d8);
          lVar10 = lVar10 + 0x30;
        } while (lVar9 * 0x30 != lVar10);
      }
      QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonArray *)&local_d0);
      QJsonArray::append((QJsonValue *)&local_c8);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QJsonArray::~QJsonArray((QJsonArray *)&local_d0);
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != lVar5);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue((QJsonValue *)&local_58,(QJsonArray *)&local_c8);
    QVar39.m_data = (char *)0xa;
    QVar39.m_size = (qsizetype)this;
    auVar41 = QJsonObject::operator[](QVar39);
    local_78._0_16_ = auVar41;
    QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)&local_58);
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  }
  QJsonArray::~QJsonArray((QJsonArray *)&local_c8);
  QJsonArray::~QJsonArray((QJsonArray *)&local_b0);
  QJsonArray::~QJsonArray((QJsonArray *)&local_a8);
  QJsonArray::~QJsonArray((QJsonArray *)&local_a0);
  QJsonArray::~QJsonArray((QJsonArray *)&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject ClassDef::toJson() const
{
    QJsonObject cls;
    cls["className"_L1] = QString::fromUtf8(classname.constData());
    cls["qualifiedClassName"_L1] = QString::fromUtf8(qualified.constData());
    cls["lineNumber"_L1] = lineNumber;

    QJsonArray classInfos;
    for (const auto &info: std::as_const(classInfoList)) {
        QJsonObject infoJson;
        infoJson["name"_L1] = QString::fromUtf8(info.name);
        infoJson["value"_L1] = QString::fromUtf8(info.value);
        classInfos.append(infoJson);
    }

    if (classInfos.size())
        cls["classInfos"_L1] = classInfos;

    int methodIndex = 0;
    const auto appendFunctions
            = [&cls, &methodIndex](const QString &type, const QList<FunctionDef> &funcs) {
        QJsonArray jsonFuncs;

        for (const FunctionDef &fdef: funcs)
            jsonFuncs.append(fdef.toJson(methodIndex++));

        if (!jsonFuncs.isEmpty())
            cls[type] = jsonFuncs;
    };

    // signals, slots, and methods, in this order, follow the same index
    appendFunctions("signals"_L1, signalList);
    appendFunctions("slots"_L1, slotList);
    appendFunctions("methods"_L1, methodList);

    // constructors are indexed separately.
    methodIndex = 0;
    appendFunctions("constructors"_L1, constructorList);

    QJsonArray props;

    for (const PropertyDef &propDef: std::as_const(propertyList))
        props.append(propDef.toJson());

    if (!props.isEmpty())
        cls["properties"_L1] = props;

    if (hasQObject)
        cls["object"_L1] = true;
    if (hasQGadget)
        cls["gadget"_L1] = true;
    if (hasQNamespace)
        cls["namespace"_L1] = true;

    QJsonArray superClasses;

    for (const auto &super: std::as_const(superclassList)) {
        QJsonObject superCls;
        superCls["name"_L1] = QString::fromUtf8(super.classname);
        if (super.classname != super.qualified)
            superCls["fullyQualifiedName"_L1] = QString::fromUtf8(super.qualified);
        FunctionDef::accessToJson(&superCls, super.access);
        superClasses.append(superCls);
    }

    if (!superClasses.isEmpty())
        cls["superClasses"_L1] = superClasses;

    QJsonArray enums;
    for (const EnumDef &enumDef: std::as_const(enumList))
        enums.append(enumDef.toJson(*this));
    if (!enums.isEmpty())
        cls["enums"_L1] = enums;

    QJsonArray ifaces;
    for (const QList<Interface> &ifaceList : interfaceList) {
        QJsonArray jsonList;
        for (const Interface &iface: ifaceList) {
            QJsonObject ifaceJson;
            ifaceJson["id"_L1] = QString::fromUtf8(iface.interfaceId);
            ifaceJson["className"_L1] = QString::fromUtf8(iface.className);
            jsonList.append(ifaceJson);
        }
        ifaces.append(jsonList);
    }
    if (!ifaces.isEmpty())
        cls["interfaces"_L1] = ifaces;

    return cls;
}